

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

void Bmc_CexDumpStats(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare,Abc_Cex_t *pCexEss,
                     Abc_Cex_t *pCexMin,abctime clk)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  FILE *pTable;
  int nBitsMin;
  int nBitsOpt;
  int nBitsEss;
  int nBitsDC;
  int nBitsCare;
  int nBitsTotal;
  int nInputs;
  abctime clk_local;
  Abc_Cex_t *pCexMin_local;
  Abc_Cex_t *pCexEss_local;
  Abc_Cex_t *pCexCare_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  uVar1 = Gia_ManPiNum(p);
  uVar2 = (pCex->iFrame + 1) * uVar1;
  iVar3 = Bmc_CexBitCount(pCexCare,uVar1);
  iVar4 = Bmc_CexBitCount(pCexEss,uVar1);
  iVar5 = Bmc_CexBitCount(pCexMin,uVar1);
  __stream = fopen("cex/stats.txt","a+");
  fprintf(__stream,"%s ",p->pName);
  fprintf(__stream,"%d ",(ulong)uVar1);
  uVar1 = Gia_ManRegNum(p);
  fprintf(__stream,"%d ",(ulong)uVar1);
  fprintf(__stream,"%d ",(ulong)(pCex->iFrame + 1));
  fprintf(__stream,"%d ",(ulong)uVar2);
  fprintf(__stream,"%.2f ",((double)(int)(uVar2 - iVar3) * 100.0) / (double)(int)uVar2);
  fprintf(__stream,"%.2f ",((double)(iVar3 - iVar4) * 100.0) / (double)(int)uVar2);
  fprintf(__stream,"%.2f ",((double)iVar4 * 100.0) / (double)(int)uVar2);
  fprintf(__stream,"%.2f ",((double)iVar5 * 100.0) / (double)(int)uVar2);
  fprintf(__stream,"%.2f ",((double)clk * 1.0) / 1000000.0);
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Bmc_CexDumpStats( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare, Abc_Cex_t * pCexEss, Abc_Cex_t * pCexMin, abctime clk )
{
    int nInputs    = Gia_ManPiNum(p);
    int nBitsTotal = (pCex->iFrame + 1) * nInputs;
    int nBitsCare  = Bmc_CexBitCount(pCexCare, nInputs);
    int nBitsDC    = nBitsTotal - nBitsCare;
    int nBitsEss   = Bmc_CexBitCount(pCexEss, nInputs);
    int nBitsOpt   = nBitsCare - nBitsEss;
    int nBitsMin   = Bmc_CexBitCount(pCexMin, nInputs);

    FILE * pTable  = fopen( "cex/stats.txt", "a+" );
    fprintf( pTable, "%s ", p->pName );
    fprintf( pTable, "%d ", nInputs );
    fprintf( pTable, "%d ", Gia_ManRegNum(p) );
    fprintf( pTable, "%d ", pCex->iFrame + 1 );
    fprintf( pTable, "%d ", nBitsTotal );
    fprintf( pTable, "%.2f ", 100.0 * nBitsDC  / nBitsTotal );
    fprintf( pTable, "%.2f ", 100.0 * nBitsOpt / nBitsTotal );
    fprintf( pTable, "%.2f ", 100.0 * nBitsEss / nBitsTotal );
    fprintf( pTable, "%.2f ", 100.0 * nBitsMin / nBitsTotal );
    fprintf( pTable, "%.2f ", 1.0*clk/(CLOCKS_PER_SEC) );
    fprintf( pTable, "\n" );
    fclose( pTable );
}